

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O3

int str_gsub(lua_State *L)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  char *p;
  lua_Integer lVar6;
  char *e;
  char *s;
  void *pvVar7;
  ushort **ppuVar8;
  size_t l_00;
  char cVar9;
  char *pcVar10;
  lua_State *plVar11;
  ulong uVar12;
  char *s_00;
  size_t l;
  size_t lp;
  size_t srcl;
  MatchState ms;
  luaL_Buffer b;
  uint local_22d4;
  long local_22c8;
  char *local_22c0;
  lua_State *local_22b8;
  size_t local_22b0;
  lua_Integer local_22a8;
  ulong local_22a0;
  lua_State *local_2298;
  size_t local_2290;
  size_t local_2288;
  char *local_2280;
  MatchState local_2278;
  luaL_Buffer local_2050;
  
  pcVar5 = luaL_checklstring(L,1,&local_2288);
  p = luaL_checklstring(L,2,&local_22b0);
  uVar3 = lua_type(L,3);
  uVar12 = (ulong)uVar3;
  lVar6 = luaL_optinteger(L,4,local_2288 + 1);
  cVar1 = *p;
  if (3 < uVar3 - 3) {
    luaL_typeerror(L,3,"string/function/table");
  }
  luaL_buffinit(L,&local_2050);
  if (cVar1 == '^') {
    local_22b0 = local_22b0 - 1;
    p = p + 1;
  }
  local_2278.p_end = p + local_22b0;
  local_22c8 = 0;
  local_22d4 = 0;
  local_2278.matchdepth = 200;
  local_2278.src_end = pcVar5 + local_2288;
  pcVar10 = (char *)0x0;
  local_22b8 = L;
  local_22a8 = lVar6;
  local_22a0 = uVar12;
  local_2278.src_init = pcVar5;
  local_2278.L = L;
  do {
    if (lVar6 <= local_22c8) break;
    local_2278.level = '\0';
    if (local_2278.matchdepth != 200) {
      __assert_fail("ms->matchdepth == 200",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstrlib.c"
                    ,0x2fe,"void reprepstate(MatchState *)");
    }
    e = match(&local_2278,pcVar5,p);
    plVar11 = local_2278.L;
    if (e == pcVar10 || e == (char *)0x0) {
      if (local_2278.src_end <= pcVar5) break;
      if (local_2050.size <= local_2050.n) {
        luaL_prepbuffsize(&local_2050,1);
      }
      local_2050.b[local_2050.n] = *pcVar5;
      e = pcVar10;
      pcVar5 = pcVar5 + 1;
      local_2050.n = local_2050.n + 1;
    }
    else {
      if ((int)uVar12 == 5) {
        push_onecapture(&local_2278,0,pcVar5,e);
        lua_gettable(plVar11,3);
LAB_00141b7e:
        iVar4 = lua_toboolean(plVar11,-1);
        if (iVar4 == 0) {
          lua_settop(plVar11,-2);
          luaL_addlstring(&local_2050,pcVar5,(long)e - (long)pcVar5);
          uVar3 = 0;
        }
        else {
          iVar4 = lua_isstring(plVar11,-1);
          if (iVar4 == 0) {
            iVar4 = lua_type(plVar11,-1);
            pcVar5 = lua_typename(plVar11,iVar4);
            uVar3 = luaL_error(plVar11,"invalid replacement value (a %s)",pcVar5);
          }
          else {
            luaL_addvalue(&local_2050);
            uVar3 = 1;
          }
        }
      }
      else {
        if ((int)uVar12 == 6) {
          lua_pushvalue(local_2278.L,3);
          iVar4 = push_captures(&local_2278,pcVar5,e);
          lua_callk(plVar11,iVar4,1,0,(lua_KFunction)0x0);
          goto LAB_00141b7e;
        }
        local_2298 = local_2278.L;
        s = lua_tolstring(local_2278.L,3,(size_t *)&local_22c0);
        pcVar10 = local_22c0;
        pvVar7 = memchr(s,0x25,(size_t)local_22c0);
        if (pvVar7 != (void *)0x0) {
          local_2290 = (long)e - (long)pcVar5;
          s_00 = s;
          do {
            luaL_addlstring(&local_2050,s_00,(long)pvVar7 - (long)s_00);
            bVar2 = *(byte *)((long)pvVar7 + 1);
            l_00 = local_2290;
            pcVar10 = pcVar5;
            if (bVar2 == 0x30) {
LAB_00141c8c:
              luaL_addlstring(&local_2050,pcVar10,l_00);
            }
            else if (bVar2 == 0x25) {
              cVar9 = '%';
              if (local_2050.size <= local_2050.n) {
                luaL_prepbuffsize(&local_2050,1);
                cVar9 = *(char *)((long)pvVar7 + 1);
              }
              local_2050.b[local_2050.n] = cVar9;
              local_2050.n = local_2050.n + 1;
            }
            else {
              ppuVar8 = __ctype_b_loc();
              if ((*(byte *)((long)*ppuVar8 + (ulong)bVar2 * 2 + 1) & 8) == 0) {
                luaL_error(local_2298,"invalid use of \'%c\' in replacement string",0x25);
              }
              else {
                l_00 = get_onecapture(&local_2278,(char)bVar2 + -0x31,pcVar5,e,&local_2280);
                pcVar10 = local_2280;
                if (l_00 != 0xfffffffffffffffe) goto LAB_00141c8c;
                luaL_addvalue(&local_2050);
              }
            }
            s = (char *)((long)pvVar7 + 2);
            pcVar10 = s_00 + ((long)local_22c0 - (long)s);
            local_22c0 = pcVar10;
            pvVar7 = memchr(s,0x25,(size_t)pcVar10);
            s_00 = s;
          } while (pvVar7 != (void *)0x0);
        }
        luaL_addlstring(&local_2050,s,(size_t)pcVar10);
        uVar3 = 1;
        uVar12 = local_22a0;
        lVar6 = local_22a8;
      }
      local_22c8 = local_22c8 + 1;
      local_22d4 = local_22d4 | uVar3;
      pcVar5 = e;
    }
    pcVar10 = e;
  } while (cVar1 != '^');
  plVar11 = local_22b8;
  if (local_22d4 == 0) {
    lua_pushvalue(local_22b8,1);
  }
  else {
    luaL_addlstring(&local_2050,pcVar5,(long)local_2278.src_end - (long)pcVar5);
    luaL_pushresult(&local_2050);
    plVar11 = local_22b8;
  }
  lua_pushinteger(plVar11,local_22c8);
  return 2;
}

Assistant:

static int str_gsub (lua_State *L) {
  size_t srcl, lp;
  const char *src = luaL_checklstring(L, 1, &srcl);  /* subject */
  const char *p = luaL_checklstring(L, 2, &lp);  /* pattern */
  const char *lastmatch = NULL;  /* end of last match */
  int tr = lua_type(L, 3);  /* replacement type */
  lua_Integer max_s = luaL_optinteger(L, 4, srcl + 1);  /* max replacements */
  int anchor = (*p == '^');
  lua_Integer n = 0;  /* replacement count */
  int changed = 0;  /* change flag */
  MatchState ms;
  luaL_Buffer b;
  luaL_argexpected(L, tr == LUA_TNUMBER || tr == LUA_TSTRING ||
                   tr == LUA_TFUNCTION || tr == LUA_TTABLE, 3,
                      "string/function/table");
  luaL_buffinit(L, &b);
  if (anchor) {
    p++; lp--;  /* skip anchor character */
  }
  prepstate(&ms, L, src, srcl, p, lp);
  while (n < max_s) {
    const char *e;
    reprepstate(&ms);  /* (re)prepare state for new match */
    if ((e = match(&ms, src, p)) != NULL && e != lastmatch) {  /* match? */
      n++;
      changed = add_value(&ms, &b, src, e, tr) | changed;
      src = lastmatch = e;
    }
    else if (src < ms.src_end)  /* otherwise, skip one character */
      luaL_addchar(&b, *src++);
    else break;  /* end of subject */
    if (anchor) break;
  }
  if (!changed)  /* no changes? */
    lua_pushvalue(L, 1);  /* return original string */
  else {  /* something changed */
    luaL_addlstring(&b, src, ms.src_end-src);
    luaL_pushresult(&b);  /* create and return new string */
  }
  lua_pushinteger(L, n);  /* number of substitutions */
  return 2;
}